

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O0

void __thiscall
re2::StringGenerator::StringGenerator
          (StringGenerator *this,int maxlen,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alphabet)

{
  size_type sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *alphabet_local;
  int maxlen_local;
  StringGenerator *this_local;
  
  this->maxlen_ = maxlen;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->alphabet_,alphabet);
  StringPiece::StringPiece(&this->sp_);
  std::__cxx11::string::string((string *)&this->s_);
  std::vector<int,_std::allocator<int>_>::vector(&this->digits_);
  this->generate_null_ = false;
  this->random_ = false;
  this->nrandom_ = 0;
  this->acm_ = (ACMRandom *)0x0;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->alphabet_);
  if (sVar1 == 0) {
    this->maxlen_ = 0;
  }
  this->hasnext_ = true;
  return;
}

Assistant:

StringGenerator::StringGenerator(int maxlen, const vector<string>& alphabet)
    : maxlen_(maxlen), alphabet_(alphabet),
      generate_null_(false),
      random_(false), nrandom_(0), acm_(NULL) {

  // Degenerate case: no letters, no non-empty strings.
  if (alphabet_.size() == 0)
    maxlen_ = 0;

  // Next() will return empty string (digits_ is empty).
  hasnext_ = true;
}